

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclPrintCells(SC_Lib *p,float SlewInit,float Gain,int fInvOnly,int fShort)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  word *pTruth;
  SC_Pin *pSVar6;
  char *pcVar7;
  float fVar8;
  float local_58;
  float local_54;
  float local_50;
  float PD;
  float LD;
  float Slew;
  int nLength;
  int k;
  int j;
  int i;
  SC_Pin *pPin;
  SC_Cell *pRepr;
  SC_Cell *pCell;
  int fShort_local;
  int fInvOnly_local;
  float Gain_local;
  float SlewInit_local;
  SC_Lib *p_local;
  
  LD = 0.0;
  local_58 = SlewInit;
  pCell._0_4_ = fShort;
  pCell._4_4_ = fInvOnly;
  fShort_local = (int)Gain;
  fInvOnly_local = (int)SlewInit;
  _Gain_local = p;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    local_58 = Abc_SclComputeAverageSlew(p);
  }
  PD = local_58;
  local_50 = 0.0;
  local_54 = 0.0;
  iVar1 = Vec_PtrSize(&_Gain_local->vCellClasses);
  if (iVar1 < 1) {
    __assert_fail("Vec_PtrSize(&p->vCellClasses) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibUtil.c"
                  ,0x283,"void Abc_SclPrintCells(SC_Lib *, float, float, int, int)");
  }
  printf("Library \"%s\" ",_Gain_local->pName);
  uVar2 = Vec_PtrSize(&_Gain_local->vCells);
  uVar3 = Vec_PtrSize(&_Gain_local->vCellClasses);
  printf("has %d cells in %d classes.  ",(ulong)uVar2,(ulong)uVar3);
  if ((int)pCell == 0) {
    printf("Delay estimate is based on slew %.2f ps and gain %.2f.",(double)PD,
           (double)(float)fShort_local);
  }
  printf("\n");
  Abc_SclMarkSkippedCells(_Gain_local);
  for (Slew = 0.0; fVar8 = Slew, iVar1 = Vec_PtrSize(&_Gain_local->vCellClasses), (int)fVar8 < iVar1
      ; Slew = (float)((int)Slew + 1)) {
    pPin = (SC_Pin *)Vec_PtrEntry(&_Gain_local->vCellClasses,(int)Slew);
    pRepr = (SC_Cell *)pPin;
    for (k = 0; fVar8 = LD, k == 0 || pRepr != (SC_Cell *)pPin; k = k + 1) {
      sVar5 = strlen(pPin->pName);
      LD = (float)Abc_MaxInt((int)fVar8,(int)sVar5);
      pRepr = pRepr->pNext;
    }
  }
  Slew = 0.0;
  while( true ) {
    fVar8 = Slew;
    iVar1 = Vec_PtrSize(&_Gain_local->vCellClasses);
    if (iVar1 <= (int)fVar8) {
      return;
    }
    pPin = (SC_Pin *)Vec_PtrEntry(&_Gain_local->vCellClasses,(int)Slew);
    if ((pCell._4_4_ == 0) || ((pPin->vRTimings).nCap == 1)) break;
LAB_00547409:
    Slew = (float)((int)Slew + 1);
  }
  k = (pPin->vRTimings).nCap;
LAB_005470cb:
  iVar1 = k;
  iVar4 = Vec_PtrSize((Vec_Ptr_t *)&pPin->vFunc);
  if (iVar1 < iVar4) {
    _j = Vec_PtrEntry((Vec_Ptr_t *)&pPin->vFunc,k);
    if (k == (pPin->vRTimings).nCap) {
      printf("Class%4d : ",(ulong)(uint)Slew);
      uVar2 = Abc_SclClassCellNum((SC_Cell *)pPin);
      printf("Cells =%3d   ",(ulong)uVar2);
      printf("Ins =%2d  ",(ulong)(uint)(pPin->vRTimings).nCap);
      printf("Outs =%2d  ",(ulong)(uint)(pPin->vRTimings).nSize);
    }
    else {
      printf("                                            ");
    }
    if (*(long *)((long)_j + 0x28) != 0) {
      printf("%-30s",*(undefined8 *)((long)_j + 0x28));
    }
    printf("    ");
    pTruth = Vec_WrdArray((Vec_Wrd_t *)((long)_j + 0x30));
    Kit_DsdPrintFromTruth((uint *)pTruth,(pPin->vRTimings).nCap);
    printf("\n");
    if ((int)pCell != 0) goto LAB_005473f9;
    pRepr = (SC_Cell *)pPin;
    for (nLength = 0; nLength == 0 || pRepr != (SC_Cell *)pPin; nLength = nLength + 1) {
      printf("  %3d ",(ulong)(nLength + 1));
      pcVar7 = " ";
      if (pRepr->fSkip != 0) {
        pcVar7 = "s";
      }
      printf("%s",pcVar7);
      printf(" : ");
      printf("%-*s  ",(ulong)(uint)LD,pRepr->pName);
      printf("%2d   ",(ulong)(uint)pRepr->drive_strength);
      printf("A =%8.2f  ",(double)pRepr->area);
      printf("L =%8.2f  ",(double)pRepr->leakage);
      if ((pRepr->n_outputs == 1) &&
         (iVar1 = Abc_SclComputeParametersCell(_Gain_local,pRepr,PD,&local_50,&local_54), iVar1 != 0
         )) {
        printf("D =%6.1f ps  ",
               (double)(float)fShort_local * 0.01 * (double)local_50 + (double)local_54);
        printf("LD =%6.1f ps  ",(double)local_50);
        printf("PD =%6.1f ps    ",(double)local_54);
        fVar8 = SC_CellPinCapAve(pRepr);
        printf("C =%5.1f ff  ",(double)fVar8);
        pSVar6 = SC_CellPin(pRepr,pRepr->n_inputs);
        printf("Cm =%5.0f ff    ",(double)pSVar6->max_out_cap);
        pSVar6 = SC_CellPin(pRepr,pRepr->n_inputs);
        printf("Sm =%5.1f ps ",(double)pSVar6->max_out_slew);
      }
      printf("\n");
      pRepr = pRepr->pNext;
    }
  }
  goto LAB_00547409;
LAB_005473f9:
  k = k + 1;
  goto LAB_005470cb;
}

Assistant:

void Abc_SclPrintCells( SC_Lib * p, float SlewInit, float Gain, int fInvOnly, int fShort )
{
    SC_Cell * pCell, * pRepr;
    SC_Pin * pPin;
    int i, j, k, nLength = 0;
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    float LD = 0, PD = 0;
    assert( Vec_PtrSize(&p->vCellClasses) > 0 );
    printf( "Library \"%s\" ", p->pName );
    printf( "has %d cells in %d classes.  ", 
        Vec_PtrSize(&p->vCells), Vec_PtrSize(&p->vCellClasses) );
    if ( !fShort )
        printf( "Delay estimate is based on slew %.2f ps and gain %.2f.", Slew, Gain );
    printf( "\n" );
    Abc_SclMarkSkippedCells( p );
    // find the longest name
    SC_LibForEachCellClass( p, pRepr, k )
        SC_RingForEachCell( pRepr, pCell, i )
            nLength = Abc_MaxInt( nLength, strlen(pRepr->pName) );
    // print cells
    SC_LibForEachCellClass( p, pRepr, k )
    {
        if ( fInvOnly && pRepr->n_inputs != 1 )
            continue;
        SC_CellForEachPinOut( pRepr, pPin, i )
        {
            if ( i == pRepr->n_inputs )
            {
                printf( "Class%4d : ",   k );
                printf( "Cells =%3d   ", Abc_SclClassCellNum(pRepr) );
                printf( "Ins =%2d  ",    pRepr->n_inputs );
                printf( "Outs =%2d  ",   pRepr->n_outputs );
            }
            else
                printf( "                                            " );
            if ( pPin->func_text )
                printf( "%-30s", pPin->func_text  );
            printf( "    "  );
            Kit_DsdPrintFromTruth( (unsigned *)Vec_WrdArray(&pPin->vFunc), pRepr->n_inputs );
            printf( "\n" );
            if ( fShort )
                continue;
            SC_RingForEachCell( pRepr, pCell, j )
            {
                printf( "  %3d ",           j+1 );
                printf( "%s",               pCell->fSkip ? "s" : " " );
                printf( " : " );
                printf( "%-*s  ",           nLength, pCell->pName );
                printf( "%2d   ",           pCell->drive_strength );
                printf( "A =%8.2f  ",       pCell->area );
                printf( "L =%8.2f  ",       pCell->leakage );
                if ( pCell->n_outputs == 1 )
                {
                    if ( Abc_SclComputeParametersCell( p, pCell, Slew, &LD, &PD ) )
                    {
                        printf( "D =%6.1f ps  ",    0.01 * Gain * LD + PD );
                        printf( "LD =%6.1f ps  ",   LD );
                        printf( "PD =%6.1f ps    ", PD );
                        printf( "C =%5.1f ff  ",    SC_CellPinCapAve(pCell) );
                        printf( "Cm =%5.0f ff    ", SC_CellPin(pCell, pCell->n_inputs)->max_out_cap );
                        printf( "Sm =%5.1f ps ",    SC_CellPin(pCell, pCell->n_inputs)->max_out_slew );
                    }
                }
                printf( "\n" );
            }
            break;
        }
    }
}